

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void Am_Choice_List_Start_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Value *local_70;
  undefined1 local_38 [8];
  Am_Value old_ref;
  bool separate_extend;
  bool extend_from_orig;
  Am_Input_Char ic;
  Am_Choice_How_Set local_18;
  Am_Choice_How_Set how_set;
  Am_Object *inter_local;
  
  how_set.value = (long)inter;
  Am_Object::Set(inter,0x16b,0,0);
  Am_Object::Set(inter,0x16a,0,0);
  Am_Object::Set(inter,0x1ef,0,1);
  pAVar2 = Am_Object::Get(inter,0xd4,0);
  Am_Choice_How_Set::Am_Choice_How_Set(&local_18,pAVar2);
  bVar1 = Am_Choice_How_Set::operator==(&local_18,Am_CHOICE_LIST_TOGGLE);
  if (bVar1) {
    pAVar2 = Am_Object::Get(inter,0x11b,0);
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)((long)&old_ref.value + 4),pAVar2);
    old_ref.value.long_value._3_1_ = old_ref.value.long_value._6_1_ & 1;
    old_ref.value.long_value._2_1_ = (byte)old_ref.value.long_value._6_1_ >> 1 & 1;
    pAVar2 = Am_Object::Peek(inter,0x12e,0);
    Am_Value::Am_Value((Am_Value *)local_38,pAVar2);
    bVar1 = Am_Value::Exists((Am_Value *)local_38);
    if (bVar1) {
      local_70 = (Am_Value *)local_38;
    }
    else {
      local_70 = &Am_No_Value;
    }
    Am_Object::Set(inter,0x1f0,local_70,1);
    if ((old_ref.value.long_value._3_1_ & 1) == 0) {
      value = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
      Am_Object::Set(inter,0x12e,value,1);
    }
    if ((old_ref.value.long_value._2_1_ & 1) == 0) {
      clear_all_objects_selected(inter);
    }
    Am_Value::~Am_Value((Am_Value *)local_38);
  }
  else {
    clear_all_objects_selected(inter);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Start_Do,
                 (Am_Object inter))
{
  inter.Set(Am_OLD_INTERIM_VALUE, 0);
  inter.Set(Am_INTERIM_VALUE, 0);
  inter.Set(Am_LAST_USED_OLD_INTERIM_VALUE, 0, Am_OK_IF_NOT_THERE);
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    bool extend_from_orig = ic.shift;
    bool separate_extend = ic.control;
    Am_Value old_ref = inter.Peek(Am_INITIAL_REF_OBJECT);
    inter.Set(Am_LAST_INITIAL_REF_OBJECT,
              old_ref.Exists() ? old_ref : Am_No_Value, Am_OK_IF_NOT_THERE);
    if (!extend_from_orig)
      inter.Set(Am_INITIAL_REF_OBJECT, Am_No_Object, Am_OK_IF_NOT_THERE);
    if (!separate_extend)
      clear_all_objects_selected(inter);
  } else {
    clear_all_objects_selected(inter);
  }
}